

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

value_type __thiscall
andres::
BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
::operator()(BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
             *this,int it)

{
  short sVar1;
  reference x;
  reference y;
  int it_local;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  *this_local;
  
  x = View<short,false,std::allocator<unsigned_long>>::operator()
                (*(View<short,false,std::allocator<unsigned_long>> **)this,it);
  y = View<short,false,std::allocator<unsigned_long>>::operator()
                (*(View<short,false,std::allocator<unsigned_long>> **)(this + 8),it);
  sVar1 = marray_detail::Plus<short,_short,_short>::operator()
                    ((Plus<short,_short,_short> *)(this + 0x10),x,y);
  return sVar1;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }